

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnTableDropExpr
          (ExprVisitorDelegate *this,TableDropExpr *expr)

{
  WatWriter *this_00;
  char *s;
  
  this_00 = this->writer_;
  s = Opcode::GetName((Opcode *)&Opcode::TableDrop_Opcode);
  WritePutsSpace(this_00,s);
  WriteVar(this->writer_,&expr->var,Newline);
  return (Result)Ok;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnTableDropExpr(TableDropExpr* expr) {
  writer_->WritePutsSpace(Opcode::TableDrop_Opcode.GetName());
  writer_->WriteVar(expr->var, NextChar::Newline);
  return Result::Ok;
}